

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O0

double __thiscall World_3df::Evaluate_fitness(World_3df *this,size_t genno)

{
  bool bVar1;
  reference psVar2;
  type pPVar3;
  type pFVar4;
  creat_t *pcVar5;
  size_type sVar6;
  ostream *this_00;
  double val;
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [32];
  Msg local_4a8;
  Msg local_478;
  Msg local_448;
  Msg local_418;
  Msg local_3e8;
  Msg local_3b8;
  Msg local_388;
  Msg local_358;
  Msg local_328;
  undefined1 local_2f8 [40];
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [55];
  allocator local_221;
  string local_220 [32];
  Msg local_200;
  Msg local_1d0;
  Msg local_1a0;
  Msg local_170;
  Msg local_140;
  Msg local_110;
  Msg local_e0;
  Msg local_b0;
  Msg local_80;
  iterator local_40;
  iterator local_38;
  iterator it;
  size_t ctr;
  double tmp;
  double ret;
  size_t genno_local;
  World_3df *this_local;
  
  tmp = 0.0;
  it._M_current = (shared_ptr<Population> *)0x0;
  local_38 = std::
             vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
             ::begin(&(this->super_World).pops);
  while( true ) {
    local_40 = std::
               vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
               ::end(&(this->super_World).pops);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffc8,&stack0xffffffffffffffc0);
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<boost::shared_ptr<Population>_*,_std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>
             ::operator*(&stack0xffffffffffffffc8);
    pPVar3 = boost::shared_ptr<Population>::operator->(psVar2);
    (*pPVar3->_vptr_Population[6])();
    World::get_log((World *)&stack0xffffffffffffffb0);
    pFVar4 = boost::shared_ptr<util::logging::File_logger>::operator*
                       ((shared_ptr<util::logging::File_logger> *)&stack0xffffffffffffffb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,0xf,'-',&local_221);
    util::logging::Msg::Msg(&local_200,(string *)local_220,L_NORM);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_258,"[",&local_259);
    util::logging::Msg::operator+(&local_1d0,&local_200,(string *)local_258);
    util::logging::Msg::operator+(&local_1a0,&local_1d0,genno);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"]: Fitnes populacji nr ",&local_281);
    util::logging::Msg::operator+(&local_170,&local_1a0,(string *)local_280);
    util::logging::Msg::operator+(&local_140,&local_170,(longlong)it._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a8," (",&local_2a9);
    util::logging::Msg::operator+(&local_110,&local_140,(string *)local_2a8);
    psVar2 = __gnu_cxx::
             __normal_iterator<boost::shared_ptr<Population>_*,_std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>
             ::operator*(&stack0xffffffffffffffc8);
    pPVar3 = boost::shared_ptr<Population>::operator->(psVar2);
    pcVar5 = Population::get_creatures(pPVar3);
    sVar6 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
            ::size(pcVar5);
    util::logging::Msg::operator+(&local_e0,&local_110,sVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,")  = ",(allocator *)(local_2f8 + 0x27));
    util::logging::Msg::operator+(&local_b0,&local_e0,(string *)local_2d0);
    util::logging::Msg::operator+(&local_80,&local_b0,val);
    (*(pFVar4->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar4,&local_80);
    util::logging::Msg::~Msg(&local_80);
    util::logging::Msg::~Msg(&local_b0);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)(local_2f8 + 0x27));
    util::logging::Msg::~Msg(&local_e0);
    util::logging::Msg::~Msg(&local_110);
    std::__cxx11::string::~string(local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    util::logging::Msg::~Msg(&local_140);
    util::logging::Msg::~Msg(&local_170);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    util::logging::Msg::~Msg(&local_1a0);
    util::logging::Msg::~Msg(&local_1d0);
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    util::logging::Msg::~Msg(&local_200);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    boost::shared_ptr<util::logging::File_logger>::~shared_ptr
              ((shared_ptr<util::logging::File_logger> *)&stack0xffffffffffffffb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,0xf,'-',&local_4c9);
    util::logging::Msg::Msg(&local_4a8,(string *)local_4c8,L_NORM);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f0,"[",&local_4f1);
    util::logging::Msg::operator+(&local_478,&local_4a8,(string *)local_4f0);
    util::logging::Msg::operator+(&local_448,&local_478,genno);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_518,"]: Fitnes populacji nr ",&local_519);
    util::logging::Msg::operator+(&local_418,&local_448,(string *)local_518);
    util::logging::Msg::operator+(&local_3e8,&local_418,(longlong)it._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_540," (",&local_541);
    util::logging::Msg::operator+(&local_3b8,&local_3e8,(string *)local_540);
    psVar2 = __gnu_cxx::
             __normal_iterator<boost::shared_ptr<Population>_*,_std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>
             ::operator*(&stack0xffffffffffffffc8);
    pPVar3 = boost::shared_ptr<Population>::operator->(psVar2);
    pcVar5 = Population::get_creatures(pPVar3);
    sVar6 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
            ::size(pcVar5);
    util::logging::Msg::operator+(&local_388,&local_3b8,sVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,")  = ",&local_569);
    util::logging::Msg::operator+(&local_358,&local_388,(string *)local_568);
    util::logging::Msg::operator+(&local_328,&local_358,val);
    util::logging::Msg::getMsg_txt_abi_cxx11_((Msg *)local_2f8);
    this_00 = std::operator<<((ostream *)&std::cout,(string *)local_2f8);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_2f8);
    util::logging::Msg::~Msg(&local_328);
    util::logging::Msg::~Msg(&local_358);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
    util::logging::Msg::~Msg(&local_388);
    util::logging::Msg::~Msg(&local_3b8);
    std::__cxx11::string::~string(local_540);
    std::allocator<char>::~allocator((allocator<char> *)&local_541);
    util::logging::Msg::~Msg(&local_3e8);
    util::logging::Msg::~Msg(&local_418);
    std::__cxx11::string::~string(local_518);
    std::allocator<char>::~allocator((allocator<char> *)&local_519);
    util::logging::Msg::~Msg(&local_448);
    util::logging::Msg::~Msg(&local_478);
    std::__cxx11::string::~string(local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    util::logging::Msg::~Msg(&local_4a8);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    it._M_current = (shared_ptr<Population> *)((long)&(it._M_current)->px + 1);
    tmp = val + tmp;
    __gnu_cxx::
    __normal_iterator<boost::shared_ptr<Population>_*,_std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>
    ::operator++(&stack0xffffffffffffffc8);
  }
  return tmp;
}

Assistant:

double World_3df::Evaluate_fitness( size_t genno )
{
	double ret = 0, tmp = 0;
	size_t ctr = 0;
	for(pop_t::iterator it = pops.begin(); it != pops.end(); ++it)
	{
		tmp = (*it)->Evaluate_fitness();

		(*get_log()) << util::logging::Msg(std::string(15, '-')) + "[" + static_cast<long long> (genno)
				+ "]: Fitnes populacji nr " + static_cast<long long> (ctr) + " ("
				+ static_cast<long long> ((*it)->get_creatures().size()) + ")  = " + tmp;

		std::cout << (util::logging::Msg(std::string(15, '-')) + "[" + static_cast<long long> (genno)
				+ "]: Fitnes populacji nr " + static_cast<long long> (ctr) + " ("
				+ static_cast<long long> ((*it)->get_creatures().size()) + ")  = " + tmp).getMsg_txt() << std::endl;

		ctr++;
		ret += tmp;

	}

	return ret;

}